

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description_is_supported
          (Impl *this,VkSubpassDescription *sub)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar1 = subpass_description_flags_is_supported(this,sub->flags);
  if (bVar1) {
    bVar1 = sub->colorAttachmentCount != 0;
    if (bVar1) {
      bVar2 = image_layout_is_supported(this,sub->pColorAttachments->layout);
      if (bVar2) {
        uVar3 = 1;
        do {
          if (sub->pResolveAttachments != (VkAttachmentReference *)0x0) {
            bVar2 = image_layout_is_supported(this,sub->pResolveAttachments[uVar3 - 1].layout);
            if (!bVar2) break;
          }
          bVar1 = uVar3 < sub->colorAttachmentCount;
          if (!bVar1) goto LAB_0010ebeb;
          bVar2 = image_layout_is_supported(this,sub->pColorAttachments[uVar3].layout);
          uVar3 = uVar3 + 1;
        } while (bVar2);
      }
      if (bVar1) goto LAB_0010ec55;
    }
LAB_0010ebeb:
    bVar1 = sub->inputAttachmentCount != 0;
    if (bVar1) {
      bVar2 = image_layout_is_supported(this,sub->pInputAttachments->layout);
      if (bVar2) {
        uVar3 = 1;
        do {
          bVar1 = uVar3 < sub->inputAttachmentCount;
          if (!bVar1) goto LAB_0010ec39;
          bVar2 = image_layout_is_supported(this,sub->pInputAttachments[uVar3].layout);
          uVar3 = uVar3 + 1;
        } while (bVar2);
      }
      if (bVar1) goto LAB_0010ec55;
    }
LAB_0010ec39:
    if (sub->pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
      bVar1 = image_layout_is_supported(this,sub->pDepthStencilAttachment->layout);
      if (!bVar1) goto LAB_0010ec55;
    }
    bVar1 = true;
  }
  else {
LAB_0010ec55:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FeatureFilter::Impl::subpass_description_is_supported(const VkSubpassDescription &sub) const
{
	if (!subpass_description_flags_is_supported(sub.flags))
		return false;

	for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
	{
		if (!attachment_reference_is_supported(sub.pColorAttachments[j]))
			return false;
		if (sub.pResolveAttachments && !attachment_reference_is_supported(sub.pResolveAttachments[j]))
			return false;
	}

	for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
		if (!attachment_reference_is_supported(sub.pInputAttachments[j]))
			return false;

	if (sub.pDepthStencilAttachment && !attachment_reference_is_supported(*sub.pDepthStencilAttachment))
		return false;

	return true;
}